

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

Vector3d * __thiscall OpenMD::StuntDouble::getVel(StuntDouble *this)

{
  Snapshot *pSVar1;
  Vector3<double> *in_RSI;
  Vector3d *in_RDI;
  Vector3d *this_00;
  
  this_00 = in_RDI;
  pSVar1 = SnapshotManager::getCurrentSnapshot
                     ((SnapshotManager *)in_RSI[1].super_Vector<double,_3U>.data_[0]);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             ((long)&(pSVar1->atomData).velocity.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
             (long)(in_RSI->super_Vector<double,_3U>).data_[2]),
             (long)*(int *)in_RSI[2].super_Vector<double,_3U>.data_);
  Vector3<double>::Vector3(this_00,in_RSI);
  return in_RDI;
}

Assistant:

Vector3d getVel() {
      return ((snapshotMan_->getCurrentSnapshot())->*storage_)
          .velocity[localIndex_];
    }